

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

BinarySection *
flatbuffers::anon_unknown_46::MakeBinarySection
          (BinarySection *__return_storage_ptr__,string *name,BinarySectionType type,
          vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *regions)

{
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *regions_local;
  BinarySectionType type_local;
  string *name_local;
  BinarySection *section;
  
  BinarySection::BinarySection(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)name);
  __return_storage_ptr__->type = type;
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::operator=
            (&__return_storage_ptr__->regions,regions);
  return __return_storage_ptr__;
}

Assistant:

static BinarySection MakeBinarySection(const std::string &name,
                                       const BinarySectionType type,
                                       std::vector<BinaryRegion> regions) {
  BinarySection section;
  section.name = name;
  section.type = type;
  section.regions = std::move(regions);
  return section;
}